

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O3

int CECoordinates::Observed2Galactic
              (double az,double zen,double *glon,double *glat,CEDate *date,CEObserver *observer,
              CEAngleType *angle_type)

{
  double longitude;
  double latitude;
  double elevation_m;
  double pressure_hPa;
  double temperature_celsius;
  double relative_humidity;
  int iVar1;
  double julian_date;
  double dut1;
  double xp;
  double yp;
  double local_80;
  double local_78;
  
  local_80 = az;
  local_78 = zen;
  if (*angle_type == DEGREES) {
    local_80 = az * 0.017453292519943295;
    local_78 = zen * 0.017453292519943295;
  }
  (*date->_vptr_CEDate[4])(date);
  longitude = observer->longitude_;
  latitude = observer->latitude_;
  elevation_m = observer->elevation_m_;
  pressure_hPa = observer->pressure_hPa_;
  temperature_celsius = observer->temperature_celsius_;
  relative_humidity = observer->relative_humidity_;
  dut1 = CEDate::dut1(date);
  xp = CEDate::xpolar(date);
  yp = CEDate::ypolar(date);
  iVar1 = Observed2Galactic(local_80,local_78,glon,glat,julian_date,longitude,latitude,elevation_m,
                            pressure_hPa,temperature_celsius,relative_humidity,dut1,xp,yp,
                            observer->wavelength_um_);
  if (*angle_type == DEGREES) {
    *glon = *glon * 57.29577951308232;
    *glat = *glat * 57.29577951308232;
  }
  return iVar1;
}

Assistant:

int CECoordinates::Observed2Galactic(double az, double zen,
                                 double *glon, double *glat,
                                 const CEDate&     date,
                                 const CEObserver& observer,
                                 const CEAngleType& angle_type)
{
    // Convert to radians if necessary
    if (angle_type == CEAngleType::DEGREES) {
        az *= DD2R ;
        zen *= DD2R ;
    }
    
    // Call the raw method
    int err_code = Observed2Galactic(az, zen, glon, glat, date.JD(),
                  observer.Longitude_Rad(), observer.Latitude_Rad(),
                  observer.Elevation_m(),
                  observer.Pressure_hPa(), observer.Temperature_C(),
                  observer.RelativeHumidity(),
                  date.dut1(),
                  date.xpolar(), date.ypolar(),
                  observer.Wavelength_um()) ;
    
    // Convert back to degrees if necessary
    if (angle_type == CEAngleType::DEGREES) {
        *glon *= DR2D ;
        *glat *= DR2D ;
    }
    
    return err_code ;
}